

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5InterrogatorBasicData.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::Mode5InterrogatorBasicData::Encode
          (Mode5InterrogatorBasicData *this,KDataStream *stream)

{
  (*(this->m_Status).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Status);
  KDataStream::Write(stream,this->m_ui8Padding);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding1);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32MsgFormats);
  (*(this->m_InterrogatedID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_InterrogatedID,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding2);
  return;
}

Assistant:

void Mode5InterrogatorBasicData::Encode( KDataStream & stream ) const
{
	stream << KDIS_STREAM m_Status
		   << m_ui8Padding
		   << m_ui16Padding1
		   << m_ui32MsgFormats
		   << KDIS_STREAM m_InterrogatedID
		   << m_ui16Padding2;
}